

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_ifelse::dump(statement_ifelse *this,ostream *o)

{
  bool bVar1;
  reference ppsVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1_1;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Self *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_90;
  _Map_pointer *local_70;
  reference local_68;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_40;
  _Elt_pointer *local_20;
  tree_node *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"< BeginIfElse: Condition = ");
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff38);
  compiler_type::dump_expr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::operator<<(local_10," >\n");
  local_20 = &in_RDI[1]._M_first;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff38);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffff38);
    if (!bVar1) break;
    local_68 = std::
               _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
               ::operator*(&local_40);
    (*(*local_68)->_vptr_statement_base[5])(*local_68,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_RDI);
  }
  std::operator<<(local_10,"< Else >\n");
  local_70 = &in_RDI[3]._M_node;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff38);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffff38);
    if (!bVar1) break;
    ppsVar2 = std::
              _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
              ::operator*(&local_90);
    (*(*ppsVar2)->_vptr_statement_base[5])(*ppsVar2,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_RDI);
  }
  std::operator<<(local_10,"< EndIfElse >\n");
  return;
}

Assistant:

void statement_ifelse::dump(std::ostream &o) const
	{
		o << "< BeginIfElse: Condition = ";
		compiler_type::dump_expr(mTree.root(), o);
		o << " >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< Else >\n";
		for (auto &ptr: mElseBlock)
			ptr->dump(o);
		o << "< EndIfElse >\n";
	}